

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMem.cpp
# Opt level: O3

void __thiscall asl::SharedMem::~SharedMem(SharedMem *this)

{
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  
  if (this->_ptr != (byte *)0x0) {
    munmap(this->_ptr,(long)this->_size);
    if ((this->_name)._size == 0) {
      __name = &(this->_name).field_2;
    }
    else {
      __name = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_name).field_2._str;
    }
    shm_unlink(__name->_space);
  }
  if ((this->_name)._size != 0) {
    free((this->_name).field_2._str);
    return;
  }
  return;
}

Assistant:

SharedMem::~SharedMem()
{
#ifdef _WIN32
	UnmapViewOfFile(_ptr);
	CloseHandle(_handle);
#elif !defined(__ANDROID__)
	if(_ptr)
	{
		munmap(_ptr, (size_t)_size);
		shm_unlink(_name);
	}
#endif
}